

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execAndiccr<(moira::Instr)11,(moira::Mode)11,(moira::Size)1>(Moira *this,u16 opcode)

{
  byte bVar1;
  u32 uVar2;
  
  uVar2 = readI<(moira::Size)1>(this);
  bVar1 = getCCR(this);
  (*this->_vptr_Moira[0x19])(this,8);
  uVar2 = logic<(moira::Instr)11,(moira::Size)1>(this,uVar2,(uint)bVar1);
  setCCR(this,(u8)uVar2);
  readM<(moira::MemSpace)1,(moira::Size)2,0ul>(this,(this->reg).pc + 2);
  prefetch<4ul>(this);
  return;
}

Assistant:

void
Moira::execAndiccr(u16 opcode)
{
    u32 src = readI<S>();
    u8  dst = getCCR();

    sync(8);

    u32 result = logic<I,S>(src, dst);
    setCCR(result);

    (void)readM<MEM_DATA, Word>(reg.pc+2);
    prefetch<POLLIPL>();
}